

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandCec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  uint nInsLimit;
  uint nConfLimit;
  uint uVar5;
  int iVar6;
  Abc_Ntk_t *pNtk;
  char *pcVar7;
  char *pcVar8;
  uint local_70;
  uint local_6c;
  Abc_Ntk_t *pNtk2;
  uint local_58;
  uint local_54;
  int fDelete2;
  int fDelete1;
  char Buffer [16];
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_54 = 0;
  Extra_UtilGetoptReset();
  nConfLimit = 10000;
  local_70 = 0x14;
  local_6c = 0;
  local_58 = 0;
  nInsLimit = 0;
  bVar2 = false;
  bVar1 = false;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"TCIPpsnvh"), iVar6 = globalUtilOptind, 0x4f < iVar4)
    {
      switch(iVar4) {
      case 0x6e:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x6f:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_0026b636_caseD_6f;
      case 0x70:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 0x73:
        local_54 = local_54 ^ 1;
        break;
      case 0x76:
        local_6c = local_6c ^ 1;
        break;
      default:
        if (iVar4 == 0x50) {
          if (globalUtilOptind < argc) {
            local_58 = atoi(argv[globalUtilOptind]);
            uVar5 = local_58;
            goto joined_r0x0026b662;
          }
          pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
        }
        else {
          if (iVar4 != 0x54) goto switchD_0026b636_caseD_6f;
          if (globalUtilOptind < argc) {
            local_70 = atoi(argv[globalUtilOptind]);
            uVar5 = local_70;
            goto joined_r0x0026b662;
          }
          pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
        }
LAB_0026b817:
        Abc_Print(-1,pcVar7);
        goto switchD_0026b636_caseD_6f;
      }
    }
    if (iVar4 != 0x43) {
      if (iVar4 == 0x49) {
        if (globalUtilOptind < argc) {
          nInsLimit = atoi(argv[globalUtilOptind]);
          uVar5 = nInsLimit;
          goto joined_r0x0026b662;
        }
        pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0026b817;
      }
      if (iVar4 == -1) {
        if ((pNtk == (Abc_Ntk_t *)0x0) || (pNtk->vPhases == (Vec_Int_t *)0x0)) {
          iVar6 = Abc_NtkPrepareTwoNtks
                            (_stdout,pNtk,argv + globalUtilOptind,argc - globalUtilOptind,
                             (Abc_Ntk_t **)Buffer,&pNtk2,&fDelete1,&fDelete2,1);
          if (iVar6 == 0) {
            return 1;
          }
          if (bVar1) {
            if (fDelete1 == 0) {
              Buffer._0_8_ = Abc_NtkStrash((Abc_Ntk_t *)Buffer._0_8_,0,1,0);
              fDelete1 = 1;
            }
            if (fDelete2 == 0) {
              pNtk2 = Abc_NtkStrash(pNtk2,0,1,0);
              fDelete2 = 1;
            }
            Abc_NtkShortNames((Abc_Ntk_t *)Buffer._0_8_);
            Abc_NtkShortNames(pNtk2);
          }
          if (bVar2) {
            Abc_NtkCecFraigPartAuto((Abc_Ntk_t *)Buffer._0_8_,pNtk2,local_70,local_6c);
          }
          else if (local_58 == 0) {
            if (local_54 == 0) {
              Abc_NtkCecFraig((Abc_Ntk_t *)Buffer._0_8_,pNtk2,local_70,local_6c);
            }
            else {
              Abc_NtkCecSat((Abc_Ntk_t *)Buffer._0_8_,pNtk2,nConfLimit,nInsLimit);
            }
          }
          else {
            Abc_NtkCecFraigPart((Abc_Ntk_t *)Buffer._0_8_,pNtk2,local_70,local_58,local_6c);
          }
          if (fDelete1 != 0) {
            Abc_NtkDelete((Abc_Ntk_t *)Buffer._0_8_);
          }
          if (fDelete2 != 0) {
            Abc_NtkDelete(pNtk2);
            return 0;
          }
          return 0;
        }
        pcVar7 = "Cannot compare networks with phases defined.\n";
        iVar6 = -1;
        goto LAB_0026b9cb;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_0026b817;
    }
    nConfLimit = atoi(argv[globalUtilOptind]);
    uVar5 = nConfLimit;
joined_r0x0026b662:
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar5);
switchD_0026b636_caseD_6f:
  if (local_58 == 0) {
    builtin_strncpy(Buffer,"unused",7);
    uVar3 = Buffer._0_4_;
    Buffer._0_8_ = CONCAT44(Buffer._4_4_,uVar3);
  }
  else {
    sprintf(Buffer,"%d");
  }
  Abc_Print(-2,"usage: cec [-T num] [-C num] [-I num] [-P num] [-psnvh] <file1> <file2>\n");
  Abc_Print(-2,"\t         performs combinational equivalence checking\n");
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",(ulong)local_70);
  Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)nConfLimit);
  Abc_Print(-2,"\t-I num : limit on the number of clause inspections [default = %d]\n",
            (ulong)nInsLimit);
  Abc_Print(-2,"\t-P num : partition size for multi-output networks [default = %s]\n",Buffer);
  pcVar8 = "yes";
  pcVar7 = "yes";
  if (!bVar2) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-p     : toggle automatic partitioning [default = %s]\n",pcVar7);
  pcVar7 = "SAT only";
  if (local_54 == 0) {
    pcVar7 = "FRAIG + SAT";
  }
  Abc_Print(-2,"\t-s     : toggle \"SAT only\" and \"FRAIG + SAT\" [default = %s]\n",pcVar7);
  pcVar7 = "by order";
  if (!bVar1) {
    pcVar7 = "by name";
  }
  Abc_Print(-2,"\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n",
            pcVar7);
  if (local_6c == 0) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar8);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
  Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
  Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
  pcVar7 = "\t         if one file is given, uses the current network and the file\n";
  iVar6 = -2;
LAB_0026b9cb:
  Abc_Print(iVar6,pcVar7);
  return 1;
}

Assistant:

int Abc_CommandCec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[16];
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fSat;
    int fVerbose;
    int nSeconds;
    int nPartSize;
    int nConfLimit;
    int nInsLimit;
    int fPartition;
    int fIgnoreNames;

    extern void Abc_NtkCecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit );
    extern void Abc_NtkCecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );
    extern void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose );
    extern void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fSat     =  0;
    fVerbose =  0;
    nSeconds = 20;
    nPartSize  = 0;
    nConfLimit = 10000;
    nInsLimit  = 0;
    fPartition = 0;
    fIgnoreNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TCIPpsnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nSeconds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSeconds < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPartSize < 0 )
                goto usage;
            break;
        case 'p':
            fPartition ^= 1;
            break;
        case 's':
            fSat ^= 1;
            break;
        case 'n':
            fIgnoreNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk && pNtk->vPhases != NULL )
    {
        Abc_Print( -1, "Cannot compare networks with phases defined.\n" );
        return 1;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2, 1 ) )
        return 1;

    if ( fIgnoreNames )
    {
        if ( !fDelete1 )
        {
            pNtk1 = Abc_NtkStrash( pNtk1, 0, 1, 0 );
            fDelete1 = 1;
        }
        if ( !fDelete2 )
        {
            pNtk2 = Abc_NtkStrash( pNtk2, 0, 1, 0 );
            fDelete2 = 1;
        }
        Abc_NtkShortNames( pNtk1 );
        Abc_NtkShortNames( pNtk2 );
    }

    // perform equivalence checking
    if ( fPartition )
        Abc_NtkCecFraigPartAuto( pNtk1, pNtk2, nSeconds, fVerbose );
    else if ( nPartSize )
        Abc_NtkCecFraigPart( pNtk1, pNtk2, nSeconds, nPartSize, fVerbose );
    else if ( fSat )
        Abc_NtkCecSat( pNtk1, pNtk2, nConfLimit, nInsLimit );
    else
        Abc_NtkCecFraig( pNtk1, pNtk2, nSeconds, fVerbose );

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    if ( nPartSize == 0 )
        strcpy( Buffer, "unused" );
    else
        sprintf(Buffer, "%d", nPartSize );
    Abc_Print( -2, "usage: cec [-T num] [-C num] [-I num] [-P num] [-psnvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs combinational equivalence checking\n" );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", nSeconds );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of clause inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-P num : partition size for multi-output networks [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-p     : toggle automatic partitioning [default = %s]\n", fPartition? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle \"SAT only\" and \"FRAIG + SAT\" [default = %s]\n", fSat? "SAT only": "FRAIG + SAT" );
    Abc_Print( -2, "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n", fIgnoreNames? "by order": "by name" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}